

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O3

void cpool_discard_conn(cpool *cpool,Curl_easy *data,connectdata *conn,_Bool aborted)

{
  curl_trc_feat *pcVar1;
  curl_off_t cVar2;
  _Bool _Var3;
  uint uVar4;
  bool bVar5;
  _Bool done;
  _Bool local_29;
  
  local_29 = false;
  _Var3 = Curl_uint_spbset_empty(&conn->xfers_attached);
  if (_Var3 || aborted) {
    bVar5 = conn->connect_only != '\0';
    conn->bits = (ConnectBits)
                 ((ulong)conn->bits & 0xffffffffdfffffff | (ulong)((uint)(bVar5 || aborted) << 0x1d)
                 );
    if (bVar5 || aborted) {
      local_29 = true;
    }
    else {
      Curl_cshutdn_run_once(cpool->idata,conn,&local_29);
      if (((local_29 & 1U) == 0) && (data->multi != (Curl_multi *)0x0)) {
        Curl_cshutdn_add(&data->multi->cshutdn,conn,cpool->num_conn);
        return;
      }
    }
    Curl_cshutdn_terminate(cpool->idata,conn,false);
  }
  else if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
           ((pcVar1 = (data->state).feat, pcVar1 == (curl_trc_feat *)0x0 || (0 < pcVar1->log_level))
           )) && (0 < Curl_trc_feat_multi.log_level)) {
    cVar2 = conn->connection_id;
    uVar4 = Curl_uint_spbset_count(&conn->xfers_attached);
    Curl_trc_multi(data,"[CPOOL] not discarding #%ld still in use by %u transfers",cVar2,
                   (ulong)uVar4);
    return;
  }
  return;
}

Assistant:

static void cpool_discard_conn(struct cpool *cpool,
                               struct Curl_easy *data,
                               struct connectdata *conn,
                               bool aborted)
{
  bool done = FALSE;

  DEBUGASSERT(data);
  DEBUGASSERT(!data->conn);
  DEBUGASSERT(cpool);
  DEBUGASSERT(!conn->bits.in_cpool);

  /*
   * If this connection is not marked to force-close, leave it open if there
   * are other users of it
   */
  if(CONN_INUSE(conn) && !aborted) {
    CURL_TRC_M(data, "[CPOOL] not discarding #%" FMT_OFF_T
               " still in use by %u transfers", conn->connection_id,
               CONN_ATTACHED(conn));
    return;
  }

  /* treat the connection as aborted in CONNECT_ONLY situations, we do
   * not know what the APP did with it. */
  if(conn->connect_only)
    aborted = TRUE;
  conn->bits.aborted = aborted;

  /* We do not shutdown dead connections. The term 'dead' can be misleading
   * here, as we also mark errored connections/transfers as 'dead'.
   * If we do a shutdown for an aborted transfer, the server might think
   * it was successful otherwise (for example an ftps: upload). This is
   * not what we want. */
  if(aborted)
    done = TRUE;
  if(!done) {
    /* Attempt to shutdown the connection right away. */
    Curl_cshutdn_run_once(cpool->idata, conn, &done);
  }

  if(done || !data->multi)
    Curl_cshutdn_terminate(cpool->idata, conn, FALSE);
  else
    Curl_cshutdn_add(&data->multi->cshutdn, conn, cpool->num_conn);
}